

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

void __thiscall
andres::graph::detail::Edge<true,_unsigned_long>::Edge
          (Edge<true,_unsigned_long> *this,Value v0,Value v1)

{
  Value v1_local;
  Value v0_local;
  Edge<true,_unsigned_long> *this_local;
  
  this->vertexIndices_[0] = v0;
  this->vertexIndices_[1] = v1;
  return;
}

Assistant:

inline
Edge<DIRECTED, T>::Edge(
    const Value v0,
    const Value v1
) {
    if(DIRECTED) { // evaluated at compile time
        vertexIndices_[0] = v0;
        vertexIndices_[1] = v1;
    }
    else {
        if(v0 <= v1) {
            vertexIndices_[0] = v0;
            vertexIndices_[1] = v1;
        }
        else {
            vertexIndices_[0] = v1;
            vertexIndices_[1] = v0;
        }
    }
}